

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledVertical.cpp
# Opt level: O3

void __thiscall
Rml::DecoratorTiledVerticalInstancer::~DecoratorTiledVerticalInstancer
          (DecoratorTiledVerticalInstancer *this)

{
  ~DecoratorTiledVerticalInstancer(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

DecoratorTiledVerticalInstancer::~DecoratorTiledVerticalInstancer() {}